

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta)

{
  longdouble *plVar1;
  int iVar2;
  bit_array *x_00;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  ulong uVar8;
  int iVar9;
  row_iterator prVar10;
  int iVar11;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar17;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar18;
  undefined1 local_b8 [20];
  longdouble local_a4;
  longdouble local_98;
  int local_8c;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_88;
  long local_80;
  long local_78;
  solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>
  *local_70;
  int *local_68;
  int *local_60;
  long local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  int *local_48;
  longdouble local_3c;
  
  local_70 = this + 8;
  local_3c = theta;
  local_98 = delta;
  local_a4 = kappa / ((longdouble)1 - kappa);
  lVar18 = in_ST5;
  local_68 = last._M_current;
  do {
    if (first._M_current == local_68) {
      return false;
    }
    if (*(int *)(this + 0x80) <= *first._M_current) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar9 = (int)local_70;
    local_80 = (long)*first._M_current;
    local_60 = first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_b8,iVar9);
    solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                *)this,(row_iterator)local_b8._8_8_,(row_iterator)local_b8._0_8_,local_3c);
    _Var12._M_head_impl = (col_value *)0x0;
    for (_Var7._M_head_impl = (int *)local_b8._8_8_; _Var7._M_head_impl != (int *)local_b8._0_8_;
        _Var7._M_head_impl = _Var7._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_50,iVar9);
      lVar14 = *(long *)(this + 0x48);
      lVar17 = (longdouble)0;
      for (; local_48 != local_50._M_head_impl; local_48 = local_48 + 2) {
        local_8c = *(int *)(lVar14 + (long)*local_48 * 4);
        lVar17 = *(longdouble *)(*(long *)(this + 0x68) + (long)*local_48 * 0x10) *
                 (longdouble)local_8c + lVar17;
        lVar18 = in_ST5;
      }
      x_00 = *(bit_array **)(this + 0x50);
      x_00[(long)_Var12._M_head_impl * 2 + 1].super_bit_array_impl.m_size = (int)_Var12._M_head_impl
      ;
      x_00[(long)_Var12._M_head_impl * 2 + 1].super_bit_array_impl.m_block_size =
           *(int *)(lVar14 + (long)*_Var7._M_head_impl * 4);
      quadratic_cost_type<long_double>::operator()
                (*(longdouble **)(this + 0x70),
                 (quadratic_cost_type<long_double> *)(ulong)(uint)*(int *)(local_b8._8_8_ + 4),
                 (int)x,x_00);
      *(longdouble *)(*(long *)(this + 0x50) + (long)_Var12._M_head_impl * 0x20) = in_ST0 - lVar17;
      _Var12._M_head_impl = (col_value *)((long)&(_Var12._M_head_impl)->value + 1);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar18;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>::rc_data*>
              (*(rc_data **)(this + 0x50),
               *(rc_data **)(this + 0x50) + ((ulong)_Var12._M_head_impl & 0xffffffff),
               *(random_engine **)this);
    local_78 = local_80 * 0xc;
    lVar14 = *(long *)(this + 0x58);
    if (*(int *)(lVar14 + local_78) < 1) {
      iVar9 = 0;
      uVar16 = 0xffffffffffffffff;
LAB_0019142d:
      iVar11 = (int)_Var12._M_head_impl;
      bVar4 = iVar9 <= *(int *)(lVar14 + 4 + local_78);
    }
    else {
      lVar15 = -0x100000000;
      lVar13 = 0;
      local_58 = (long)((int)_Var12._M_head_impl + -2);
      lVar14 = *(long *)(this + 0x50);
      iVar9 = 0;
      lVar5 = -1;
      local_88._M_head_impl = _Var12._M_head_impl;
      do {
        uVar3 = local_b8._8_8_;
        iVar9 = iVar9 + *(int *)(lVar14 + 0x14 + lVar13);
        lVar15 = lVar15 + 0x100000000;
        iVar11 = *(int *)(lVar14 + 0x10 + lVar13);
        iVar2 = *(int *)(*(long *)(this + 0x58) + local_78);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_b8._8_8_ + (long)iVar11 * 8))->column);
        lVar14 = *(long *)(this + 0x50);
        lVar6 = (long)((row_iterator)(uVar3 + (long)iVar11 * 8))->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar6) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar6) +
             local_98 + local_a4 * *(longdouble *)(lVar14 + lVar13) * (longdouble)0.5;
        if (iVar2 <= iVar9) break;
        lVar13 = lVar13 + 0x20;
        bVar4 = lVar5 < local_58;
        lVar5 = lVar5 + 1;
      } while (bVar4);
      lVar14 = *(long *)(this + 0x58);
      uVar16 = lVar15 >> 0x20;
      _Var12._M_head_impl = local_88._M_head_impl;
      lVar18 = in_ST5;
      if (*(int *)(lVar14 + local_78) <= iVar9) goto LAB_0019142d;
      iVar11 = (int)local_88._M_head_impl;
      bVar4 = false;
    }
    lVar14 = uVar16 << 5;
    uVar8 = uVar16;
    while( true ) {
      uVar8 = uVar8 + 1;
      uVar16 = uVar16 + 1;
      if (((ulong)(long)iVar11 <= uVar16) || (!bVar4)) break;
      lVar5 = *(long *)(this + 0x50);
      iVar9 = iVar9 + *(int *)(lVar5 + 0x34 + lVar14);
      if (iVar9 < *(int *)(*(long *)(this + 0x58) + local_78)) {
        prVar10 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar5 + 0x30 + lVar14) * 8);
LAB_001914ef:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar10->column);
        lVar5 = (long)prVar10->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar5) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar5) -
             (local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar14) * (longdouble)0.5);
        bVar4 = false;
      }
      else {
        prVar10 = (row_iterator)(local_b8._8_8_ + (long)*(int *)(lVar5 + 0x30 + lVar14) * 8);
        if ((*(int *)(*(long *)(this + 0x58) + local_78 + 4) < iVar9) ||
           (bVar4 = stop_iterating<baryonyx::itm::maximize_tag,long_double>
                              (*(longdouble *)(lVar5 + 0x20 + lVar14),*(random_engine **)this),
           !bVar4)) goto LAB_001914ef;
        bit_array_impl::set(&x->super_bit_array_impl,prVar10->column);
        lVar5 = (long)prVar10->value * 0x10;
        *(longdouble *)(*(long *)(this + 0x68) + lVar5) =
             *(longdouble *)(*(long *)(this + 0x68) + lVar5) +
             local_98 +
             local_a4 * *(longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar14) * (longdouble)0.5;
        bVar4 = true;
      }
      lVar14 = lVar14 + 0x20;
      lVar18 = in_ST5;
    }
    for (; uVar3 = local_b8._8_8_, uVar8 < (ulong)(long)iVar11; uVar8 = uVar8 + 1) {
      iVar9 = *(int *)(*(long *)(this + 0x50) + 0x30 + lVar14);
      bit_array_impl::unset
                (&x->super_bit_array_impl,((row_iterator)(local_b8._8_8_ + (long)iVar9 * 8))->column
                );
      plVar1 = (longdouble *)(*(long *)(this + 0x50) + 0x20 + lVar14);
      lVar14 = lVar14 + 0x20;
      lVar5 = (long)((row_iterator)(uVar3 + (long)iVar9 * 8))->value * 0x10;
      *(longdouble *)(*(long *)(this + 0x68) + lVar5) =
           *(longdouble *)(*(long *)(this + 0x68) + lVar5) -
           (local_98 + local_a4 * *plVar1 * (longdouble)0.5);
      lVar18 = in_ST5;
    }
    bVar4 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                        *)this,(int)local_80,x);
    if (!bVar4) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    first._M_current = local_60 + 1;
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }